

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

bool __thiscall
Js::InlineCache::GetGetterSetter
          (InlineCache *this,RecyclableObject *object,RecyclableObject **callee)

{
  Type *pTVar1;
  Type *pTVar2;
  DynamicObject *pDVar3;
  Var aValue;
  RecyclableObject *pRVar4;
  
  *callee = (RecyclableObject *)0x0;
  if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x6) == (undefined1  [24])0x0
     ) {
    return false;
  }
  pTVar1 = (object->type).ptr;
  if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x8) != (undefined1  [24])0x0
     ) {
    object = (RecyclableObject *)(this->u).local.type;
  }
  pTVar2 = (Type *)(this->u).proto.prototypeObject;
  if (pTVar1 == pTVar2) {
    pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    aValue = DynamicObject::GetInlineSlot(pDVar3,(uint)(this->u).accessor.slotIndex);
  }
  else {
    if (pTVar2 != (Type *)((ulong)pTVar1 | 4)) {
      return false;
    }
    pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    aValue = DynamicObject::GetAuxSlot(pDVar3,(uint)(this->u).accessor.slotIndex);
  }
  pRVar4 = VarTo<Js::RecyclableObject>(aValue);
  *callee = pRVar4;
  return true;
}

Assistant:

bool InlineCache::GetGetterSetter(RecyclableObject *object, RecyclableObject **callee)
    {
        *callee = nullptr;

        if (u.accessor.flags & (InlineCacheGetterFlag | InlineCacheSetterFlag))
        {
            Type *type = object->GetType();
            Type *const taggedType = TypeWithAuxSlotTag(type);
            if (u.accessor.isOnProto)
            {
               object = u.accessor.object;
            }

            if (type == u.accessor.type)
            {
                *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(object)->GetInlineSlot(u.accessor.slotIndex));
                return true;
            }
            else if (taggedType == u.accessor.type)
            {
                *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(object)->GetAuxSlot(u.accessor.slotIndex));
                return true;
            }
        }
        return false;
    }